

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O1

int fy_atom_iter_utf8_get(fy_atom_iter *iter)

{
  uint uVar1;
  undefined8 in_RAX;
  ssize_t sVar2;
  int iVar3;
  uint uVar4;
  int w;
  uint8_t buf [4];
  int local_18;
  undefined4 local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  uVar4 = 0xffffffff;
  if (iter != (fy_atom_iter *)0x0) {
    uVar1 = iter->unget_c;
    if (uVar1 == 0xffffffff) {
      sVar2 = fy_atom_iter_read(iter,&local_14,1);
      if (sVar2 == 1) {
        iVar3 = 1;
        if ((((char)local_14 < '\0') && (iVar3 = 2, (local_14 & 0xe0) != 0xc0)) &&
           (iVar3 = 3, (local_14 & 0xf0) != 0xe0)) {
          iVar3 = (uint)((local_14 & 0xf8) == 0xf0) << 2;
        }
        _local_18 = CONCAT44(local_14,iVar3);
        if (iVar3 != 0) {
          if (iVar3 != 1) {
            sVar2 = fy_atom_iter_read(iter,(void *)((long)&local_14 + 1),(ulong)(iVar3 - 1));
            if (sVar2 != (long)local_18 + -1) {
              return -1;
            }
          }
          if (0 < local_18) {
            uVar4 = (uint)(char)local_14;
            if ((char)local_14 < '\0') {
              uVar4 = fy_utf8_get_generic(&local_14,local_18,&local_18);
            }
          }
        }
      }
    }
    else {
      iter->unget_c = -1;
      uVar4 = uVar1 & 0xff;
    }
  }
  return uVar4;
}

Assistant:

int fy_atom_iter_utf8_get(struct fy_atom_iter *iter) {
    uint8_t buf[4];    /* maximum utf8 is 4 octets */
    ssize_t nread;
    int c, w;

    if (!iter)
        return -1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        return c & 0xff;
    }

    /* read first octet */
    nread = fy_atom_iter_read(iter, &buf[0], 1);
    if (nread != 1)
        return -1;

    /* get width from it (0 means illegal) */
    w = fy_utf8_width_by_first_octet(buf[0]);
    if (!w)
        return -1;

    /* read the rest octets (if possible) */
    if (w > 1) {
        nread = fy_atom_iter_read(iter, buf + 1, w - 1);
        if (nread != (w - 1))
            return -1;
    }

    /* and return the decoded utf8 character */
    return fy_utf8_get(buf, w, &w);
}